

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::GenerateSerializationCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  string_view text;
  
  text._M_str = 
  "if ($has_property_check$) {\n  output.WriteRawTag($tag_bytes$);\n  output.Write$capitalized_type_name$($property_name$);\n}\n"
  ;
  text._M_len = 0x79;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void PrimitiveFieldGenerator::GenerateSerializationCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if ($has_property_check$) {\n"
    "  output.WriteRawTag($tag_bytes$);\n"
    "  output.Write$capitalized_type_name$($property_name$);\n"
    "}\n");
}